

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O1

istream * operator>>(istream *stream,Msk3Header *header)

{
  int iVar1;
  Msk3HeaderSwitch h;
  undefined1 auStack_38 [12];
  uint32_t uStack_2c;
  uint32_t local_28;
  
  iVar1 = detectSwitch(stream);
  if (iVar1 < 0) {
    header->isSwitch = false;
    std::istream::read((char *)stream,(long)auStack_38);
    header->width = (uint16_t)auStack_38._8_4_;
    header->height = SUB42(auStack_38._8_4_,2);
    header->compressedSize = uStack_2c;
  }
  else {
    header->isSwitch = true;
    std::istream::read((char *)stream,(long)auStack_38);
    header->width = (undefined2)uStack_2c;
    header->height = uStack_2c._2_2_;
    header->compressedSize = local_28;
  }
  return stream;
}

Assistant:

std::istream& operator>>(std::istream& stream, Msk3Header& header) {
	int version = detectSwitch(stream);
	if (version < 0) { // PS3
		readMsk3<Msk3HeaderPS3>(stream, header);
	} else { // Switch
		readMsk3<Msk3HeaderSwitch>(stream, header);
	}
	return stream;
}